

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::
Section9ValidSelfIssuedrequireExplicitPolicyTest6<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::TestBody(Section9ValidSelfIssuedrequireExplicitPolicyTest6<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.9.6";
  local_88.should_validate = true;
  PkitsTestInfo::SetUserConstrainedPolicySet(&local_88,"");
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<4ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_3f4b62_006ba250,(char *(*) [4])&PTR_anon_var_dwarf_3f4b94_006ba270,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest09RequireExplicitPolicy,
                     Section9ValidSelfIssuedrequireExplicitPolicyTest6) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "requireExplicitPolicy2CACert",
                               "requireExplicitPolicy2SelfIssuedCACert",
                               "ValidSelfIssuedrequireExplicitPolicyTest6EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "requireExplicitPolicy2CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.9.6";
  info.should_validate = true;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}